

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O2

int __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>::ClassId
          (TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_89;
  string local_88;
  TPZQuadSphere<pzgeom::TPZGeoQuad> local_68;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"TPZGeoElRefLess",&local_89);
  uVar1 = Hash(&local_88);
  iVar2 = TPZGeoEl::ClassId(&this->super_TPZGeoEl);
  pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>::TPZQuadSphere(&local_68);
  iVar3 = pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>::ClassId(&local_68);
  pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>::~TPZQuadSphere(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}